

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O1

void __thiscall
MADPComponentDiscreteActions::SetNrActions(MADPComponentDiscreteActions *this,Index AI,size_t nrA)

{
  iterator __position;
  ostream *poVar1;
  undefined8 *puVar2;
  ulong uVar3;
  uint uVar4;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> thisAgentsActions;
  stringstream ss;
  size_t local_280;
  string local_278;
  vector<ActionDiscrete,_std::allocator<ActionDiscrete>_> local_258;
  MADPComponentDiscreteActions *local_240;
  _func_int **local_238;
  string local_230;
  ActionDiscrete local_210;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  __position._M_current =
       (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  local_280 = nrA;
  if ((long)__position._M_current -
      (long)(this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start >> 3 == (ulong)AI) {
    local_240 = this;
    if (__position._M_current ==
        (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_long,std::allocator<unsigned_long>>::
      _M_realloc_insert<unsigned_long_const&>
                ((vector<unsigned_long,std::allocator<unsigned_long>> *)&this->_m_nrActions,
                 __position,&local_280);
    }
    else {
      *__position._M_current = nrA;
      (this->_m_nrActions).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
      .super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    local_258.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_258.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_258.super__Vector_base<ActionDiscrete,_std::allocator<ActionDiscrete>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (local_280 != 0) {
      uVar4 = 1;
      local_238 = (_func_int **)&PTR__ActionDiscrete_005d0e08;
      do {
        std::__cxx11::stringstream::stringstream(local_1b8);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"a",1);
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__cxx11::stringbuf::str();
        local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_278,"undefined","");
        NamedDescribedEntity::NamedDescribedEntity
                  ((NamedDescribedEntity *)&local_210,&local_230,&local_278);
        local_210.super_DiscreteEntity._m_index = uVar4 - 1;
        local_210.super_Action.super_NamedDescribedEntity._vptr_NamedDescribedEntity = local_238;
        local_210.super_DiscreteEntity._vptr_DiscreteEntity =
             (_func_int **)&PTR__ActionDiscrete_005d0e38;
        std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::emplace_back<ActionDiscrete>
                  (&local_258,&local_210);
        NamedDescribedEntity::~NamedDescribedEntity((NamedDescribedEntity *)&local_210);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_278._M_dataplus._M_p != &local_278.field_2) {
          operator_delete(local_278._M_dataplus._M_p,local_278.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_230._M_dataplus._M_p != &local_230.field_2) {
          operator_delete(local_230._M_dataplus._M_p,local_230.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::stringstream::~stringstream(local_1b8);
        std::ios_base::~ios_base(local_138);
        uVar3 = (ulong)uVar4;
        uVar4 = uVar4 + 1;
      } while (uVar3 < local_280);
    }
    std::
    vector<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>,_std::allocator<std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>_>_>
    ::push_back(&local_240->_m_actionVecs,&local_258);
    std::vector<ActionDiscrete,_std::allocator<ActionDiscrete>_>::~vector(&local_258);
    return;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>
            (local_1a8,"MADPComponentDiscreteActions::SetNrAction(",0x2a);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,",",1);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,") - error, actions of agents should be specified in order!",0x3a);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1," (the vector _m_nrActions should contain entries for all ",0x39);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,"preceeding agents.)",0x13);
  puVar2 = (undefined8 *)__cxa_allocate_exception(0x28);
  *puVar2 = &PTR__E_0059bd80;
  std::__cxx11::stringbuf::str();
  __cxa_throw(puVar2,&E::typeinfo,E::~E);
}

Assistant:

void MADPComponentDiscreteActions::SetNrActions(Index AI, size_t nrA)
{
    if(_m_nrActions.size() != AI)
    {
        stringstream ss;
        ss << "MADPComponentDiscreteActions::SetNrAction("<<AI<<","<<
            nrA<<
            ") - error, actions of agents should be specified in order!"<<
            " (the vector _m_nrActions should contain entries for all "<<
            "preceeding agents.)";
        throw(E(ss));
    }
    else
    {
        _m_nrActions.push_back(nrA);
        //create nameless actions for this agent...    
        vector<ActionDiscrete> thisAgentsActions;
        for(Index i=0;i<nrA;i++)
        {
            stringstream ss;
            ss //<< "ag"<<AI
                <<"a"<<i;
            thisAgentsActions.push_back(ActionDiscrete(i, ss.str() ));
        }
        _m_actionVecs.push_back(thisAgentsActions);
    }
}